

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_points.cpp
# Opt level: O0

void __thiscall
Am_Drawonable_Impl::Get_Polygon_Bounding_Box
          (Am_Drawonable_Impl *this,Am_Point_List *pl,Am_Style *ls,int *out_left,int *out_top,
          int *width,int *height)

{
  unsigned_short uVar1;
  int local_ac;
  int local_a8;
  int top_1;
  int left_1;
  int bottom_1;
  int right_1;
  int th;
  int local_84;
  int local_80;
  int top;
  int left;
  int bottom;
  int right;
  Am_Image_Array local_68;
  Am_Image_Array stipple;
  Am_Fill_Solid_Flag local_58;
  Am_Fill_Poly_Flag poly;
  Am_Fill_Solid_Flag fill;
  int dashl;
  char *dash;
  Am_Line_Solid_Flag solid;
  Am_Join_Style_Flag join;
  Am_Line_Cap_Style_Flag cap;
  short thick;
  int *width_local;
  int *out_top_local;
  int *out_left_local;
  Am_Style *ls_local;
  Am_Point_List *pl_local;
  Am_Drawonable_Impl *this_local;
  
  _cap = width;
  width_local = out_top;
  out_top_local = out_left;
  out_left_local = (int *)ls;
  ls_local = (Am_Style *)pl;
  pl_local = (Am_Point_List *)this;
  Am_Image_Array::Am_Image_Array(&local_68);
  Am_Style::Get_Values
            ((Am_Style *)out_left_local,(short *)((long)&join + 2),&solid,
             (Am_Join_Style_Flag *)((long)&dash + 4),(Am_Line_Solid_Flag *)&dash,(char **)&fill,
             (int *)&poly,&local_58,(Am_Fill_Poly_Flag *)((long)&stipple.data + 4),&local_68);
  if ((0 < (short)join._2_2_) && (dash._4_4_ == 0)) {
    uVar1 = Am_Point_List::Length((Am_Point_List *)ls_local);
    if (2 < uVar1) {
      Am_Point_List::Am_Point_List((Am_Point_List *)&right_1,(Am_Point_List *)ls_local);
      compute_mitered_join_extents
                ((Am_Point_List *)&right_1,(int)(short)join._2_2_,solid,&local_80,&local_84,&left,
                 &top);
      Am_Point_List::~Am_Point_List((Am_Point_List *)&right_1);
      *out_top_local = local_80;
      *width_local = local_84;
      *_cap = (left - local_80) + 1;
      *height = (top - local_84) + 1;
      goto LAB_0037f0bf;
    }
  }
  bottom_1 = (int)(short)join._2_2_ / 2;
  Am_Point_List::Get_Extents((Am_Point_List *)ls_local,&local_a8,&local_ac,&left_1,&top_1);
  *out_top_local = local_a8 - bottom_1;
  *width_local = local_ac - bottom_1;
  *_cap = (left_1 - local_a8) + 1 + bottom_1 * 2;
  *height = (top_1 - local_ac) + 1 + bottom_1 * 2;
LAB_0037f0bf:
  Am_Image_Array::~Am_Image_Array(&local_68);
  return;
}

Assistant:

void
Am_Drawonable_Impl::Get_Polygon_Bounding_Box(const Am_Point_List &pl,
                                             const Am_Style &ls, int &out_left,
                                             int &out_top, int &width,
                                             int &height)
{
  short thick;
  Am_Line_Cap_Style_Flag cap;
  Am_Join_Style_Flag join;
  Am_Line_Solid_Flag solid;
  const char *dash;
  int dashl;
  Am_Fill_Solid_Flag fill;
  Am_Fill_Poly_Flag poly;
  Am_Image_Array stipple;

  ls.Get_Values(thick, cap, join, solid, dash, dashl, fill, poly, stipple);

  if (thick > 0 && join == Am_JOIN_MITER && pl.Length() > 2) {
    int right, bottom, left, top;
    // slow: does several flops per point to compute the true vertex of
    // the mitered join
    compute_mitered_join_extents(pl, thick, cap, left, top, right, bottom);
    out_left = left;
    out_top = top;
    width = right - left + 1;
    height = bottom - top + 1;
  } else {
    const int th = thick / 2;

    // fast: just four comparisons per point, then adjust thickness
    int right, bottom, left, top;
    pl.Get_Extents(left, top, right, bottom);

    out_left = left - th;
    out_top = top - th;
    width = right - left + 1 + 2 * th;
    height = bottom - top + 1 + 2 * th;
  }
}